

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::GenerateMessageHeader
          (MessageGenerator *this,Printer *printer)

{
  string *psVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  FieldDescriptor **ppFVar6;
  FieldGenerator *pFVar7;
  Descriptor *pDVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pointer ppOVar10;
  int i;
  long lVar11;
  int i_1;
  long lVar12;
  pointer ppOVar13;
  pointer ppEVar14;
  pointer ppMVar15;
  allocator_type local_e2;
  value_type local_e1;
  string *local_e0;
  vector<char,_std::allocator<char>_> seen_oneofs;
  string message_comments;
  SourceLocation location;
  
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x6b) == '\x01') {
    for (ppMVar15 = (this->nested_message_generators_).
                    super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        ppMVar15 !=
        (this->nested_message_generators_).
        super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppMVar15 = ppMVar15 + 1) {
      GenerateMessageHeader(*ppMVar15,printer);
    }
  }
  else {
    psVar1 = &this->class_name_;
    io::Printer::Print(printer,"#pragma mark - $classname$\n\n","classname",psVar1);
    if (*(int *)(this->descriptor_ + 0x2c) != 0) {
      location._0_8_ = anon_unknown_7::SortFieldsByNumber(this->descriptor_);
      io::Printer::Print(printer,"typedef GPB_ENUM($classname$_FieldNumber) {\n","classname",psVar1)
      ;
      io::Printer::Indent(printer);
      for (lVar11 = 0; lVar11 < *(int *)(this->descriptor_ + 0x2c); lVar11 = lVar11 + 1) {
        ppFVar6 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                            ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)&location,
                             lVar11);
        pFVar7 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar6);
        FieldGenerator::GenerateFieldNumberConstant(pFVar7,printer);
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"};\n\n");
      internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array
                ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)&location);
    }
    for (ppOVar13 = (this->oneof_generators_).
                    super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        ppOVar13 !=
        (this->oneof_generators_).
        super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppOVar13 = ppOVar13 + 1) {
      OneofGenerator::GenerateCaseEnum(*ppOVar13,printer);
    }
    message_comments._M_dataplus._M_p = (pointer)&message_comments.field_2;
    message_comments._M_string_length = 0;
    location.leading_comments._M_dataplus._M_p = (pointer)&location.leading_comments.field_2;
    location.leading_comments._M_string_length = 0;
    location.leading_comments.field_2._M_local_buf[0] = '\0';
    paVar9 = &location.trailing_comments.field_2;
    location.trailing_comments._M_string_length = 0;
    message_comments.field_2._M_local_buf[0] = '\0';
    location.trailing_comments.field_2._M_local_buf[0] = '\0';
    location.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    location.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    location.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    location.trailing_comments._M_dataplus._M_p = (pointer)paVar9;
    bVar4 = Descriptor::GetSourceLocation(this->descriptor_,&location);
    if (bVar4) {
      BuildCommentsString_abi_cxx11_
                ((string *)&seen_oneofs,(objectivec *)&location,(SourceLocation *)0x0,
                 SUB81(paVar9,0));
      std::__cxx11::string::operator=((string *)&message_comments,(string *)&seen_oneofs);
      std::__cxx11::string::~string((string *)&seen_oneofs);
    }
    else {
      std::__cxx11::string::assign((char *)&message_comments);
    }
    io::Printer::Print(printer,
                       "$comments$$deprecated_attribute$@interface $classname$ : GPBMessage\n\n",
                       "classname",psVar1,"deprecated_attribute",&this->deprecated_attribute_,
                       "comments",&message_comments);
    local_e1 = '\0';
    local_e0 = psVar1;
    std::vector<char,_std::allocator<char>_>::vector
              (&seen_oneofs,(long)*(int *)(this->descriptor_ + 0x38),&local_e1,&local_e2);
    lVar11 = 0;
    for (lVar12 = 0; lVar12 < *(int *)(this->descriptor_ + 0x2c); lVar12 = lVar12 + 1) {
      lVar2 = *(long *)(this->descriptor_ + 0x30);
      lVar3 = *(long *)(lVar2 + 0x60 + lVar11);
      if (lVar3 != 0) {
        iVar5 = (int)((lVar3 - *(long *)(*(long *)(lVar3 + 0x10) + 0x40)) / 0x30);
        if (seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[iVar5] == '\0') {
          seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[iVar5] = '\x01';
          OneofGenerator::GeneratePublicCasePropertyDeclaration
                    ((this->oneof_generators_).
                     super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar5],printer);
        }
      }
      pFVar7 = FieldGeneratorMap::get(&this->field_generators_,(FieldDescriptor *)(lVar2 + lVar11));
      (*pFVar7->_vptr_FieldGenerator[3])(pFVar7,printer);
      lVar11 = lVar11 + 0xa8;
    }
    io::Printer::Print(printer,"@end\n\n");
    psVar1 = local_e0;
    lVar12 = 0;
    for (lVar11 = 0; pDVar8 = this->descriptor_, lVar11 < *(int *)(pDVar8 + 0x2c);
        lVar11 = lVar11 + 1) {
      pFVar7 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar8 + 0x30) + lVar12));
      (*pFVar7->_vptr_FieldGenerator[5])(pFVar7,printer);
      lVar12 = lVar12 + 0xa8;
    }
    ppOVar13 = (this->oneof_generators_).
               super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppOVar10 = (this->oneof_generators_).
               super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppOVar13 != ppOVar10) {
      for (; ppOVar13 != ppOVar10; ppOVar13 = ppOVar13 + 1) {
        OneofGenerator::GenerateClearFunctionDeclaration(*ppOVar13,printer);
        ppOVar10 = (this->oneof_generators_).
                   super__Vector_base<google::protobuf::compiler::objectivec::OneofGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::OneofGenerator_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      io::Printer::Print(printer,"\n");
      pDVar8 = this->descriptor_;
    }
    if (0 < *(int *)(pDVar8 + 0x78)) {
      io::Printer::Print(printer,"@interface $classname$ (DynamicMethods)\n\n","classname",psVar1);
      for (ppEVar14 = (this->extension_generators_).
                      super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          ppEVar14 !=
          (this->extension_generators_).
          super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_finish; ppEVar14 = ppEVar14 + 1) {
        ExtensionGenerator::GenerateMembersHeader(*ppEVar14,printer);
      }
      io::Printer::Print(printer,"@end\n\n");
    }
    for (ppMVar15 = (this->nested_message_generators_).
                    super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        ppMVar15 !=
        (this->nested_message_generators_).
        super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppMVar15 = ppMVar15 + 1) {
      GenerateMessageHeader(*ppMVar15,printer);
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&seen_oneofs.super__Vector_base<char,_std::allocator<char>_>);
    SourceLocation::~SourceLocation(&location);
    std::__cxx11::string::~string((string *)&message_comments);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateMessageHeader(io::Printer* printer) {
  // This a a map entry message, just recurse and do nothing directly.
  if (IsMapEntryMessage(descriptor_)) {
    for (vector<MessageGenerator*>::iterator iter =
             nested_message_generators_.begin();
         iter != nested_message_generators_.end(); ++iter) {
      (*iter)->GenerateMessageHeader(printer);
    }
    return;
  }

  printer->Print(
      "#pragma mark - $classname$\n"
      "\n",
      "classname", class_name_);

  if (descriptor_->field_count()) {
    scoped_array<const FieldDescriptor*> sorted_fields(
        SortFieldsByNumber(descriptor_));

    printer->Print("typedef GPB_ENUM($classname$_FieldNumber) {\n",
                   "classname", class_name_);
    printer->Indent();

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(sorted_fields[i])
          .GenerateFieldNumberConstant(printer);
    }

    printer->Outdent();
    printer->Print("};\n\n");
  }

  for (vector<OneofGenerator*>::iterator iter = oneof_generators_.begin();
       iter != oneof_generators_.end(); ++iter) {
    (*iter)->GenerateCaseEnum(printer);
  }

  string message_comments;
  SourceLocation location;
  if (descriptor_->GetSourceLocation(&location)) {
    message_comments = BuildCommentsString(location, false);
  } else {
    message_comments = "";
  }

  printer->Print(
      "$comments$$deprecated_attribute$@interface $classname$ : GPBMessage\n\n",
      "classname", class_name_,
      "deprecated_attribute", deprecated_attribute_,
      "comments", message_comments);

  vector<char> seen_oneofs(descriptor_->oneof_decl_count(), 0);
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->containing_oneof() != NULL) {
      const int oneof_index = field->containing_oneof()->index();
      if (!seen_oneofs[oneof_index]) {
        seen_oneofs[oneof_index] = 1;
        oneof_generators_[oneof_index]->GeneratePublicCasePropertyDeclaration(
            printer);
      }
    }
    field_generators_.get(field).GeneratePropertyDeclaration(printer);
  }

  printer->Print("@end\n\n");

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
        .GenerateCFunctionDeclarations(printer);
  }

  if (!oneof_generators_.empty()) {
    for (vector<OneofGenerator*>::iterator iter = oneof_generators_.begin();
         iter != oneof_generators_.end(); ++iter) {
      (*iter)->GenerateClearFunctionDeclaration(printer);
    }
    printer->Print("\n");
  }

  if (descriptor_->extension_count() > 0) {
    printer->Print("@interface $classname$ (DynamicMethods)\n\n",
                   "classname", class_name_);
    for (vector<ExtensionGenerator*>::iterator iter =
             extension_generators_.begin();
         iter != extension_generators_.end(); ++iter) {
      (*iter)->GenerateMembersHeader(printer);
    }
    printer->Print("@end\n\n");
  }

  for (vector<MessageGenerator*>::iterator iter =
           nested_message_generators_.begin();
       iter != nested_message_generators_.end(); ++iter) {
    (*iter)->GenerateMessageHeader(printer);
  }
}